

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

const_iterator * __thiscall
pstore::index::
hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::find<pstore::indirect_string,void>
          (const_iterator *__return_storage_ptr__,void *this,database *db,indirect_string *key)

{
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *phVar1;
  bool bVar2;
  uint64_t uVar3;
  address addr;
  uint uVar4;
  index_pointer node_00;
  pair<pstore::index::details::index_pointer,_unsigned_long> pVar5;
  internal_node *internal;
  index_pointer node;
  shared_ptr<const_void> store_node;
  key_type existing_key;
  parent_stack parents;
  internal_node *local_170;
  index_pointer local_168;
  index_pointer local_160;
  undefined8 *local_158;
  const_iterator *local_150;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_148;
  indirect_string *local_140;
  undefined8 local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_130 [2];
  index_pointer local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118 [2];
  array_stack<pstore::index::details::parent_type,_13UL> local_108;
  
  bVar2 = hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
          ::empty((hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                   *)this);
  if (bVar2) {
    memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->db_ = db;
    __return_storage_ptr__->index_ =
         (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
    ._M_head_impl = (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
  }
  else {
    local_150 = __return_storage_ptr__;
    local_140 = key;
    uVar3 = fnv_64a_hash_indirect_string::operator()
                      ((fnv_64a_hash_indirect_string *)((long)this + 0x28),key);
    node_00 = *(index_pointer *)((long)this + 0x18);
    uVar4 = 0;
    local_168 = node_00;
    local_148 = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                 *)this;
    memset(&local_108,0,0xd8);
    local_138 = 0;
    a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while (((ulong)node_00.internal_ & 1) != 0) {
      if (uVar4 < 0x42) {
        local_170 = (internal_node *)0x0;
        details::internal_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                    *)&local_120.addr_,db,node_00);
        local_160.internal_ = (internal_node *)&local_170;
        local_158 = &local_138;
        std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
        operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>
                   *)&local_160.addr_,
                  (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                   *)&local_120.addr_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_118);
        pVar5 = details::internal_node::lookup(local_170,(ulong)((uint)uVar3 & 0x3f));
      }
      else {
        local_170 = (internal_node *)0x0;
        details::linear_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                    *)&local_120.addr_,db,node_00);
        local_160.internal_ = (internal_node *)&local_170;
        local_158 = &local_138;
        std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
        operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *
                  )&local_160.addr_,
                  (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                   *)&local_120.addr_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_118);
        pVar5 = (pair<pstore::index::details::index_pointer,_unsigned_long>)
                details::linear_node::
                lookup<pstore::indirect_string,pstore::indirect_string,std::equal_to<pstore::indirect_string>,void>
                          ((linear_node *)local_170,db,local_140);
      }
      __return_storage_ptr__ = local_150;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar5.second ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
        memset(&local_150->visited_parents_,0,0xd8);
        __return_storage_ptr__->db_ = db;
        __return_storage_ptr__->index_ = local_148;
        goto LAB_00109351;
      }
      local_120 = node_00;
      local_118[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar5.second;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (&local_108,(value_type *)&local_120.addr_);
      uVar4 = uVar4 + 6;
      uVar3 = uVar3 >> 6;
      node_00 = pVar5.first;
      local_168 = pVar5.first;
    }
    addr = details::index_pointer::to_address((index_pointer *)&local_168.addr_);
    phVar1 = local_148;
    hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
    ::get_key((key_type *)&local_120.addr_,local_148,db,addr);
    bVar2 = indirect_string::operator==((indirect_string *)&local_120.addr_,local_140);
    __return_storage_ptr__ = local_150;
    if (bVar2) {
      local_160 = local_168;
      local_158 = (undefined8 *)0xffffffffffffffff;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (&local_108,(value_type *)&local_160.addr_);
      __return_storage_ptr__->db_ = db;
      memcpy(&__return_storage_ptr__->visited_parents_,&local_108,0xd8);
    }
    else {
      memset(&local_150->visited_parents_,0,0xd8);
      __return_storage_ptr__->db_ = db;
    }
    __return_storage_ptr__->index_ = phVar1;
LAB_00109351:
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
    ._M_head_impl = (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_130);
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }